

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O0

cell * references::scheme::proc_head(cell *__return_storage_ptr__,cells *c)

{
  const_reference pvVar1;
  cells *c_local;
  
  pvVar1 = std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::
           operator[](c,0);
  pvVar1 = std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::
           operator[](&pvVar1->list,0);
  cell::cell(__return_storage_ptr__,pvVar1);
  return __return_storage_ptr__;
}

Assistant:

cell proc_head(const cells & c) { return c[0].list[0]; }